

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O1

size_t rcnb_encode(char *plaintext_in,size_t length_in,wchar_t *code_out)

{
  wchar_t *pwVar1;
  size_t sVar2;
  rcnb_encodestate es;
  wchar_t *code_char;
  rcnb_encodestate local_22;
  wchar_t *local_20;
  
  local_22.cached = false;
  sVar2 = rcnb_encode_block(plaintext_in,length_in,code_out,&local_22);
  pwVar1 = code_out + sVar2;
  local_20 = pwVar1;
  if (local_22.cached == true) {
    rcnb_encode_byte(local_22.trailing_byte,&local_20);
  }
  *local_20 = L'\0';
  return ((long)local_20 - (long)pwVar1 >> 2) + sVar2;
}

Assistant:

size_t rcnb_encode(const char* plaintext_in, size_t length_in, wchar_t* code_out)
{
    rcnb_encodestate es;
    rcnb_init_encodestate(&es);
    size_t output_size = 0;
    output_size += rcnb_encode_block(plaintext_in, length_in, code_out, &es);
    output_size += rcnb_encode_blockend(code_out + output_size, &es);
    return output_size;
}